

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

gc_heap_ptr<mjs::gc_string> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::gc_string,std::basic_string_view<char,std::char_traits<char>>const&>
          (gc_heap *this,size_t num_bytes,basic_string_view<char,_std::char_traits<char>_> *args)

{
  string_view *in_RCX;
  slot *this_00;
  undefined8 extraout_RDX;
  allocation_result aVar1;
  gc_heap_ptr<mjs::gc_string> gVar2;
  
  aVar1 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  this_00 = aVar1.obj;
  if (((gc_string *)((long)this_00 + -4))->length_ == 0xffffffff) {
    gc_string::gc_string((gc_string *)&this_00->allocation,in_RCX);
    ((gc_string *)((long)this_00 + -4))->length_ =
         gc_type_info_registration<mjs::gc_string>::reg._40_4_;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)this,(gc_heap *)num_bytes,aVar1.pos);
    gVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar2.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::gc_string>)gVar2.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::gc_string, Args = <const std::basic_string_view<char> &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}